

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O2

string * __thiscall
bloaty::wasm::WebAssemblyObjectFile::GetBuildId_abi_cxx11_
          (string *__return_storage_ptr__,WebAssemblyObjectFile *this)

{
  InputFile *pIVar1;
  wasm *this_00;
  char *pcVar2;
  anon_class_8_1_3fcf65d9 *in_R8;
  string_view file;
  allocator<char> local_41;
  undefined1 local_40 [40];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pIVar1 = (this->super_ObjectFile).file_data_._M_t.
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  this_00 = (wasm *)(pIVar1->data_)._M_len;
  pcVar2 = (pIVar1->data_)._M_str;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_40 + 8),"sourceMappingURL",&local_41);
  file._M_str = local_40 + 8;
  file._M_len = (size_t)pcVar2;
  local_40._0_8_ = __return_storage_ptr__;
  FindSection<bloaty::wasm::WebAssemblyObjectFile::GetBuildId[abi:cxx11]()const::_lambda(bloaty::wasm::Section&)_1_>
            (this_00,file,(string *)local_40,in_R8);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string GetBuildId() const override {
    // Use the sourceMappingURL as the build ID to be able to match to the
    // source map.
    std::string id;

    FindSection(file_data().data(), "sourceMappingURL",
                [&id](Section& section) {
                  uint32_t size = ReadVarUInt32(&section.contents);
                  string_view source_mapping_url =
                      ReadPiece(size, &section.contents);
                  id.assign(source_mapping_url);
                });

    return id;
  }